

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O1

C_Type * union_decl(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  int iVar1;
  C_Type *pCVar2;
  C_Member *pCVar3;
  int iVar4;
  int iVar5;
  
  pCVar2 = struct_union_decl(parser,rest,tok);
  pCVar2->kind = TY_UNION;
  if (-1 < pCVar2->size) {
    pCVar3 = pCVar2->members;
    if (pCVar3 != (C_Member *)0x0) {
      iVar4 = pCVar2->size;
      iVar5 = pCVar2->align;
      do {
        iVar1 = pCVar3->align;
        if (iVar5 < iVar1) {
          pCVar2->align = iVar1;
          iVar5 = iVar1;
        }
        iVar1 = pCVar3->ty->size;
        if (iVar4 < iVar1) {
          pCVar2->size = iVar1;
          iVar4 = iVar1;
        }
        pCVar3 = pCVar3->next;
      } while (pCVar3 != (C_Member *)0x0);
    }
    iVar4 = pCVar2->size + -1 + pCVar2->align;
    pCVar2->size = iVar4 - iVar4 % pCVar2->align;
  }
  return pCVar2;
}

Assistant:

static C_Type *union_decl(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Type *ty = struct_union_decl(parser, rest, tok);
  ty->kind = TY_UNION;

  if (ty->size < 0)
    return ty;

  // If union, we don't have to assign offsets because they
  // are already initialized to zero. We need to compute the
  // alignment and the size though.
  for (C_Member *mem = ty->members; mem; mem = mem->next) {
    if (ty->align < mem->align)
      ty->align = mem->align;
    if (ty->size < mem->ty->size)
      ty->size = mem->ty->size;
  }
  ty->size = C_align_to(ty->size, ty->align);
  return ty;
}